

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O1

void RDL_fillURFs(RDL_URFinfo *uInfo,RDL_cfURF *CFs)

{
  long lVar1;
  void *__ptr;
  void *pvVar2;
  ulong uVar3;
  RDL_cfam ***URFs;
  uint *puVar4;
  uint *puVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint local_5c;
  
  uVar3 = (ulong)uInfo->nofWeights;
  __ptr = malloc(uVar3 * 8);
  if (uVar3 != 0) {
    puVar4 = uInfo->nofProtos;
    uVar8 = 0;
    do {
      pvVar2 = malloc((ulong)puVar4[uVar8]);
      *(void **)((long)__ptr + uVar8 * 8) = pvVar2;
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  if (uInfo->nofWeights != 0) {
    uVar3 = 0;
    do {
      if (uInfo->nofProtos[uVar3] != 0) {
        lVar1 = *(long *)((long)__ptr + uVar3 * 8);
        uVar8 = 0;
        do {
          *(undefined1 *)(lVar1 + uVar8) = 0;
          uVar8 = uVar8 + 1;
        } while (uVar8 < uInfo->nofProtos[uVar3]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uInfo->nofWeights);
  }
  uVar3 = (ulong)uInfo->nofURFs;
  URFs = (RDL_cfam ***)malloc(uVar3 * 8);
  puVar4 = (uint *)malloc(uVar3 * 4);
  if (uVar3 != 0) {
    memset(puVar4,0,uVar3 * 4);
  }
  if (uInfo->nofWeights != 0) {
    uVar3 = 0;
    local_5c = 0;
    do {
      if (uInfo->nofProtos[uVar3] != 0) {
        uVar8 = 0;
        do {
          if ((uInfo->URFrel[uVar3][uVar8][uVar8] == '\x01') &&
             (lVar1 = *(long *)((long)__ptr + uVar3 * 8), *(char *)(lVar1 + uVar8) == '\0')) {
            puVar5 = uInfo->nofProtos;
            if (uVar8 < puVar5[uVar3]) {
              uVar9 = uVar8;
              do {
                if (uInfo->URFrel[uVar3][uVar8][uVar9] == '\x01') {
                  if (uVar3 == 0) {
                    iVar6 = 0;
                  }
                  else {
                    uVar7 = 0;
                    iVar6 = 0;
                    do {
                      iVar6 = iVar6 + puVar5[uVar7];
                      uVar7 = uVar7 + 1;
                    } while (uVar3 != uVar7);
                  }
                  RDL_addRCFtoURF((int)uVar9 + iVar6,local_5c,puVar4[local_5c],URFs,CFs);
                  puVar4[local_5c] = puVar4[local_5c] + 1;
                  *(undefined1 *)(lVar1 + uVar9) = 1;
                }
                uVar9 = uVar9 + 1;
                puVar5 = uInfo->nofProtos;
              } while (uVar9 < puVar5[uVar3]);
            }
            local_5c = local_5c + 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uInfo->nofProtos[uVar3]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uInfo->nofWeights);
  }
  if (uInfo->nofWeights != 0) {
    uVar3 = 0;
    do {
      free(*(void **)((long)__ptr + uVar3 * 8));
      uVar3 = uVar3 + 1;
    } while (uVar3 < uInfo->nofWeights);
  }
  free(__ptr);
  uInfo->URFs = URFs;
  uInfo->nofCFsPerURF = puVar4;
  return;
}

Assistant:

void RDL_fillURFs(RDL_URFinfo *uInfo, RDL_cfURF *CFs)
{
  RDL_cfam ***URFs;
  unsigned *nofRCFs;
  unsigned currURFIdx=0;
  unsigned i,j,k;
  char **alreadyInURF; /*for each weight: an array storing if a RCF is already
                        part of a URF*/

  alreadyInURF = malloc(uInfo->nofWeights * sizeof(*alreadyInURF));
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    alreadyInURF[i] = malloc(uInfo->nofProtos[i] * sizeof(*alreadyInURF[i]));
  }
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      alreadyInURF[i][j] = 0;
    }
  }

  URFs = malloc(uInfo->nofURFs * sizeof(*URFs));
  nofRCFs = malloc(uInfo->nofURFs * sizeof(*nofRCFs));
  for(i=0; i<uInfo->nofURFs; ++i)
  {
    nofRCFs[i] = 0;
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      /*if this family is not already part of a URF*/
      if((uInfo->URFrel[i][j][j] == 1) && (alreadyInURF[i][j] == 0))
      {
        for(k=j; k<uInfo->nofProtos[i]; ++k)
        {
          if(uInfo->URFrel[i][j][k] == 1)
          {
            /*add to current URF the CFs with the given Idx*/
            RDL_addRCFtoURF(RDL_idxWeight(uInfo,i,k),currURFIdx,
                            nofRCFs[currURFIdx],URFs,CFs);
            ++nofRCFs[currURFIdx];
            alreadyInURF[i][k] = 1;
          }
        }
        ++currURFIdx;
      }
    }
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    free(alreadyInURF[i]);
  }
  free(alreadyInURF);
  uInfo->URFs=URFs;
  uInfo->nofCFsPerURF = nofRCFs;
}